

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.h
# Opt level: O2

ostream * operator<<(ostream *out,Company *cp)

{
  Employee **ppEVar1;
  Employee *pEVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Company *this;
  ostream *poVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int i;
  long lVar12;
  double dVar13;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this = (Company *)operator_new(0x18);
  Company::Company(this,cp);
  uVar11 = 0;
  bVar4 = false;
LAB_00103c73:
  do {
    bVar5 = bVar4;
    uVar11 = uVar11 & 0xffffffff;
    do {
      uVar10 = uVar11;
      iVar6 = Boss::getNumberOfEmployees(this->boss);
      iVar6 = iVar6 + -1;
      iVar9 = (int)uVar10;
      bVar4 = iVar9 < iVar6;
      if (iVar6 <= iVar9) {
        uVar11 = 0;
        if (bVar5) goto LAB_00103c73;
        uVar11 = 0;
        bVar4 = false;
        goto LAB_00103d21;
      }
      Person::getName_abi_cxx11_(&local_b0,&this->employees[uVar10]->super_Person);
      uVar11 = uVar10 + 1;
      uVar8 = uVar11 & 0xffffffff;
      Person::getName_abi_cxx11_(&local_90,&this->employees[uVar8]->super_Person);
      bVar3 = std::operator>(&local_b0,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    } while (!bVar3);
    ppEVar1 = this->employees;
    pEVar2 = ppEVar1[uVar10];
    ppEVar1[uVar10] = ppEVar1[uVar8];
    ppEVar1[uVar8] = pEVar2;
  } while( true );
LAB_00103d21:
  uVar11 = uVar11 & 0xffffffff;
  do {
    uVar10 = uVar11;
    iVar6 = Boss::getNumberOfEmployees(this->boss);
    iVar6 = iVar6 + -1;
    iVar9 = (int)uVar10;
    if (iVar6 <= iVar9) {
      uVar11 = 0;
      bVar5 = !bVar4;
      bVar4 = iVar9 < iVar6;
      if (bVar5) {
        poVar7 = std::operator<<(out,"Boss : ");
        poVar7 = operator<<(poVar7,this->boss);
        poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
        std::endl<char,std::char_traits<char>>(poVar7);
        lVar12 = 0;
        while( true ) {
          iVar6 = Boss::getNumberOfEmployees(this->boss);
          if (iVar6 <= lVar12) break;
          poVar7 = operator<<(out,this->employees[lVar12]);
          std::endl<char,std::char_traits<char>>(poVar7);
          dVar13 = Employee::efficiency(this->employees[lVar12]);
          poVar7 = std::ostream::_M_insert<double>(dVar13);
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          std::endl<char,std::char_traits<char>>(poVar7);
          lVar12 = lVar12 + 1;
        }
        return out;
      }
      goto LAB_00103d21;
    }
    Person::getId_abi_cxx11_(&local_90,&this->employees[uVar10]->super_Person);
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_90);
    uVar11 = uVar10 + 1;
    uVar8 = uVar11 & 0xffffffff;
    Person::getId_abi_cxx11_(&local_70,&this->employees[uVar8]->super_Person);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
    bVar5 = std::operator<(&local_b0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  } while (!bVar5);
  ppEVar1 = this->employees;
  pEVar2 = ppEVar1[uVar10];
  ppEVar1[uVar10] = ppEVar1[uVar8];
  ppEVar1[uVar8] = pEVar2;
  bVar4 = iVar9 < iVar6;
  goto LAB_00103d21;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Company &cp) {
          auto *temp = new Company(cp);
        bool flag = true;
        while (flag) {
            flag = false;
            for (int i = 0; i < temp->boss->getNumberOfEmployees() - 1; ++i) {
                if (temp->employees[i]->getName() > temp->employees[i + 1]->getName()) {
                    std::swap(temp->employees[i], temp->employees[i + 1]);
                    flag = true;
                }
            }
        }
        flag = true;
        while (flag) {
            flag = false;
            for (int i = 0; i < temp->boss->getNumberOfEmployees() - 1; ++i) {
                if (temp->employees[i]->getId().substr(0, 2) < temp->employees[i + 1]->getId().substr(0, 2)) {
                    std::swap(temp->employees[i], temp->employees[i + 1]);
                    flag = true;
                }
            }
        }


        out << "Boss : "<<*(temp->boss) << std::endl << std::endl;
        for (int i = 0; i < temp->boss->getNumberOfEmployees(); ++i) {
            out << *(temp->employees[i]) << std::endl << temp->employees[i]->efficiency() << std::endl << std::endl;

        }
        return out;
    }